

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStreamWrapper::tryGetReadBuffer(BufferedInputStreamWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if ((this->bufferAvailable).size_ == 0) {
    iVar1 = (*this->inner->_vptr_InputStream[2])
                      (this->inner,(this->buffer).ptr,(this->buffer).size_,1);
    (this->bufferAvailable).ptr = (this->buffer).ptr;
    (this->bufferAvailable).size_ = CONCAT44(extraout_var,iVar1);
  }
  return this->bufferAvailable;
}

Assistant:

ArrayPtr<const byte> BufferedInputStreamWrapper::tryGetReadBuffer() {
  if (bufferAvailable.size() == 0) {
    size_t n = inner.tryRead(buffer, 1);
    bufferAvailable = buffer.first(n);
  }

  return bufferAvailable;
}